

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O3

void __thiscall
vkt::memory::anon_unknown_0::PipelineBarrier::logSubmit
          (PipelineBarrier *this,TestLog *log,size_t commandIndex)

{
  ostringstream *this_00;
  int iVar1;
  undefined4 extraout_var;
  size_t sVar2;
  char *pcVar3;
  char *__s;
  Bitfield<32UL> local_218;
  Bitfield<32UL> local_1f8;
  Bitfield<32UL> local_1e0;
  Bitfield<32UL> local_1c8;
  Bitfield<32UL> local_1b0;
  undefined1 local_198 [384];
  
  this_00 = (ostringstream *)(local_198 + 8);
  local_198._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::ostream::_M_insert<unsigned_long>((ulong)this_00);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,":",1);
  iVar1 = (*(this->super_CmdCommand)._vptr_CmdCommand[2])(this);
  pcVar3 = (char *)CONCAT44(extraout_var,iVar1);
  if (pcVar3 == (char *)0x0) {
    std::ios::clear((int)this_00 + (int)*(undefined8 *)(local_198._8_8_ + -0x18));
  }
  else {
    sVar2 = strlen(pcVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar3,sVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," ",1);
  pcVar3 = "Image pipeline barrier";
  if (this->m_type == TYPE_BUFFER) {
    pcVar3 = "Buffer pipeline barrier";
  }
  __s = "Global pipeline barrier";
  if (this->m_type != TYPE_GLOBAL) {
    __s = pcVar3;
  }
  sVar2 = strlen(__s);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,__s,sVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", srcStages: ",0xd);
  ::vk::getPipelineStageFlagsStr(&local_1b0,this->m_srcStages);
  local_218.m_end = local_1b0.m_end;
  local_218.m_value = local_1b0.m_value;
  local_218.m_begin = local_1b0.m_begin;
  tcu::Format::Bitfield<32UL>::toStream(&local_218,(ostream *)this_00);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", srcAccesses: ",0xf);
  ::vk::getAccessFlagsStr(&local_1c8,this->m_srcAccesses);
  local_218.m_end = local_1c8.m_end;
  local_218.m_value = local_1c8.m_value;
  local_218.m_begin = local_1c8.m_begin;
  tcu::Format::Bitfield<32UL>::toStream(&local_218,(ostream *)this_00);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", dstStages: ",0xd);
  ::vk::getPipelineStageFlagsStr(&local_1e0,this->m_dstStages);
  local_218.m_end = local_1e0.m_end;
  local_218.m_value = local_1e0.m_value;
  local_218.m_begin = local_1e0.m_begin;
  tcu::Format::Bitfield<32UL>::toStream(&local_218,(ostream *)this_00);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", dstAccesses: ",0xf);
  ::vk::getAccessFlagsStr(&local_1f8,this->m_dstAccesses);
  local_218.m_end = local_1f8.m_end;
  local_218.m_value = local_1f8.m_value;
  local_218.m_begin = local_1f8.m_begin;
  tcu::Format::Bitfield<32UL>::toStream(&local_218,(ostream *)this_00);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  std::ios_base::~ios_base((ios_base *)(local_198 + 0x78));
  return;
}

Assistant:

void PipelineBarrier::logSubmit (TestLog& log, size_t commandIndex) const
{
	log << TestLog::Message << commandIndex << ":" << getName()
		<< " " << (m_type == TYPE_GLOBAL ? "Global pipeline barrier"
					: m_type == TYPE_BUFFER ? "Buffer pipeline barrier"
					: "Image pipeline barrier")
		<< ", srcStages: " << vk::getPipelineStageFlagsStr(m_srcStages) << ", srcAccesses: " << vk::getAccessFlagsStr(m_srcAccesses)
		<< ", dstStages: " << vk::getPipelineStageFlagsStr(m_dstStages) << ", dstAccesses: " << vk::getAccessFlagsStr(m_dstAccesses) << TestLog::EndMessage;
}